

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O0

void __thiscall binpac::FlowBuffer::MarkOrCopyFrame(FlowBuffer *this)

{
  int len;
  const_byteptr in_RDI;
  FlowBuffer *unaff_retaddr;
  int bytes_to_copy;
  int in_stack_fffffffffffffff4;
  
  if (((*(int *)(in_RDI + 0x44) == 2) && (*(int *)(in_RDI + 0x48) == 1)) &&
     (*(ulong *)(in_RDI + 0x28) < *(ulong *)(in_RDI + 0x30))) {
    if (**(char **)(in_RDI + 0x28) == '\n') {
      *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + 1;
    }
    in_RDI[0x48] = '\x04';
    in_RDI[0x49] = '\0';
    in_RDI[0x4a] = '\0';
    in_RDI[0x4b] = '\0';
  }
  if (*(int *)(in_RDI + 8) == 0) {
    if ((*(int *)(in_RDI + 0x1c) < 0) ||
       (*(long *)(in_RDI + 0x30) - *(long *)(in_RDI + 0x28) < (long)*(int *)(in_RDI + 0x1c))) {
      if ((in_RDI[0x20] & 1) == 0) {
        AppendToBuffer(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4);
      }
      in_RDI[0x18] = '\0';
    }
    else {
      in_RDI[0x18] = '\x01';
    }
  }
  else {
    len = (int)*(undefined8 *)(in_RDI + 0x30) - (int)*(undefined8 *)(in_RDI + 0x28);
    in_RDI[0x18] = '\0';
    if ((-1 < *(int *)(in_RDI + 0x1c)) && (*(int *)(in_RDI + 0x1c) <= *(int *)(in_RDI + 8) + len)) {
      len = *(int *)(in_RDI + 0x1c) - *(int *)(in_RDI + 8);
      in_RDI[0x18] = '\x01';
    }
    AppendToBuffer(unaff_retaddr,in_RDI,len);
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyFrame()
	{
	if ( mode_ == FRAME_MODE && state_ == CR_OR_LF_1 && orig_data_begin_ < orig_data_end_ )
		{
		// Skip the lingering LF
		if ( *orig_data_begin_ == LF )
			{
			++orig_data_begin_;
			}
		state_ = FRAME_0;
		}

	if ( buffer_n_ == 0 )
		{
		// If there is enough data
		if ( frame_length_ >= 0 && orig_data_end_ - orig_data_begin_ >= frame_length_ )
			{
			// Do nothing except setting the message complete flag
			message_complete_ = true;
			}
		else
			{
			if ( ! chunked_ )
				{
				AppendToBuffer(orig_data_begin_, orig_data_end_ - orig_data_begin_);
				}
			message_complete_ = false;
			}
		}
	else
		{
		BINPAC_ASSERT(! chunked_);
		int bytes_to_copy = orig_data_end_ - orig_data_begin_;
		message_complete_ = false;
		if ( frame_length_ >= 0 && buffer_n_ + bytes_to_copy >= frame_length_ )
			{
			bytes_to_copy = frame_length_ - buffer_n_;
			message_complete_ = true;
			}
		AppendToBuffer(orig_data_begin_, bytes_to_copy);
		}

#if DEBUG_FLOW_BUFFER
	if ( message_complete_ )
		{
		fprintf(stderr, "%.6f frame complete: [%s]\n", network_time(),
		        string((const char*)begin(), (const char*)end()).c_str());
		}
#endif
	}